

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode * __thiscall JSONNode::operator[](JSONNode *this,json_index_t pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  jsonChildren *pjVar2;
  internalJSONNode *piVar3;
  JSONNode *pJVar4;
  undefined8 extraout_RAX;
  json_index_t jVar5;
  size_type __dnew;
  json_string local_50;
  size_type local_30;
  
  piVar3 = this->internal;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar3 != (internalJSONNode *)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  piVar3 = this->internal;
  jVar5 = 0;
  if (0xfd < (byte)(piVar3->_type - 6)) {
    internalJSONNode::Fetch(piVar3);
    pjVar2 = piVar3->Children;
    local_30 = 0x15;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    local_50._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
    local_50.field_2._M_allocated_capacity._0_7_ = (undefined7)local_30;
    local_50.field_2._M_local_buf[7] = (char)(local_30 >> 0x38);
    builtin_strncpy(local_50._M_dataplus._M_p,"Children is null size",0x15);
    local_50._M_string_length = local_30;
    local_50._M_dataplus._M_p[local_30] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    jVar5 = pjVar2->mysize;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[] out of bounds","");
  JSONDebug::_JSON_ASSERT(pos < jVar5,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_50.field_2._7_4_ = 0x6c616e72;
  local_50._M_string_length = 0xb;
  local_50.field_2._M_local_buf[0xb] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  piVar3 = internalJSONNode::makeUnique(this->internal);
  this->internal = piVar3;
  if ((piVar3->_type & 0xfe) == 4) {
    internalJSONNode::Fetch(piVar3);
    pJVar4 = jsonChildren::operator[](piVar3->Children,pos);
    return pJVar4;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"calling at on non-container type","");
  operator[]();
  __cxa_call_unexpected(extraout_RAX);
}

Assistant:

JSONNode & JSONNode::operator[](json_index_t pos) json_nothrow {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(pos < internal -> size(), JSON_TEXT("[] out of bounds"));
    makeUniqueInternal();
    return *(internal -> at(pos));
}